

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

CPAccessResult gt_timer_access(CPUARMState_conflict *env,int timeridx,_Bool isread)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  uint64_t hcr;
  _Bool secure;
  uint cur_el;
  _Bool isread_local;
  int timeridx_local;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_current_el(env);
  _Var1 = arm_is_secure(env);
  uVar4 = arm_hcr_el2_eff_aarch64(env);
  if (iVar2 == 0) {
    if ((uVar4 & 0x408000000) == 0x408000000) {
      uVar3 = extract32((env->cp15).cnthctl_el2,9 - timeridx,1);
      if (uVar3 != 0) {
        return CP_ACCESS_OK;
      }
      return CP_ACCESS_TRAP_EL2;
    }
    uVar3 = extract32((uint32_t)(env->cp15).c14_cntkctl,9 - timeridx,1);
    if (uVar3 == 0) {
      return CP_ACCESS_TRAP;
    }
  }
  else if (iVar2 != 1) {
    return CP_ACCESS_OK;
  }
  iVar2 = arm_feature(env,0x20);
  if (((iVar2 != 0) && (timeridx == 0)) && (!_Var1)) {
    if ((uVar4 & 0x400000000) == 0) {
      uVar3 = extract32((env->cp15).cnthctl_el2,1,1);
      if (uVar3 == 0) {
        return CP_ACCESS_TRAP_EL2;
      }
    }
    else {
      uVar3 = extract32((env->cp15).cnthctl_el2,0xb,1);
      if (uVar3 == 0) {
        return CP_ACCESS_TRAP_EL2;
      }
    }
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult gt_timer_access(CPUARMState *env, int timeridx,
                                      bool isread)
{
    unsigned int cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);
    uint64_t hcr = arm_hcr_el2_eff(env);

    switch (cur_el) {
    case 0:
        if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
            /* If HCR_EL2.<E2H,TGE> == '11': check CNTHCTL_EL2.EL0[PV]TEN. */
            return (extract32(env->cp15.cnthctl_el2, 9 - timeridx, 1)
                    ? CP_ACCESS_OK : CP_ACCESS_TRAP_EL2);
        }

        /*
         * CNT[PV]_CVAL, CNT[PV]_CTL, CNT[PV]_TVAL: not visible from
         * EL0 if EL0[PV]TEN is zero.
         */
        if (!extract32(env->cp15.c14_cntkctl, 9 - timeridx, 1)) {
            return CP_ACCESS_TRAP;
        }
        /* fall through */

    case 1:
        if (arm_feature(env, ARM_FEATURE_EL2) &&
            timeridx == GTIMER_PHYS && !secure) {
            if (hcr & HCR_E2H) {
                /* If HCR_EL2.<E2H,TGE> == '10': check CNTHCTL_EL2.EL1PTEN. */
                if (!extract32(env->cp15.cnthctl_el2, 11, 1)) {
                    return CP_ACCESS_TRAP_EL2;
                }
            } else {
                /* If HCR_EL2.<E2H> == 0: check CNTHCTL_EL2.EL1PCEN. */
                if (!extract32(env->cp15.cnthctl_el2, 1, 1)) {
                    return CP_ACCESS_TRAP_EL2;
                }
            }
        }
        break;
    }
    return CP_ACCESS_OK;
}